

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::CheckTxOutIndex(Psbt *this,uint32_t index,int line,char *caller)

{
  CfdException *pCVar1;
  char *pcVar2;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  CfdSourceLocation location_1;
  string local_f0;
  undefined1 local_d0 [8];
  CfdSourceLocation location;
  string local_b0;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  void *local_28;
  wally_psbt *psbt_pointer;
  char *caller_local;
  int line_local;
  uint32_t index_local;
  Psbt *this_local;
  
  local_28 = this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)caller;
  caller_local._0_4_ = line;
  caller_local._4_4_ = index;
  _line_local = this;
  if (local_28 == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0xd05;
    local_40.funcname = "CheckTxOutIndex";
    logger::warn<>(&local_40,"psbt pointer is null");
    local_75 = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt pointer is null.",&local_61);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_60);
    local_75 = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)((long)local_28 + 8) == 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0xd08;
    local_90.funcname = "CheckTxOutIndex";
    logger::warn<>(&local_90,"psbt base tx is null");
    location.funcname._6_1_ = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_b0,"psbt base tx is null.",
               (allocator *)((long)&location.funcname + 7));
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_b0);
    location.funcname._6_1_ = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(ulong *)((long)local_28 + 0x30) <= (ulong)index) {
    pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
    local_d0 = (undefined1  [8])(pcVar2 + 1);
    location.filename._0_4_ = (int)caller_local;
    location._8_8_ = psbt_pointer;
    logger::warn<unsigned_int&>
              ((CfdSourceLocation *)local_d0,"psbt vout[{}] out_of_range.",
               (uint *)((long)&caller_local + 4));
    location_1.funcname._6_1_ = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_f0,"psbt vout out_of_range error.",
               (allocator *)((long)&location_1.funcname + 7));
    CfdException::CfdException(pCVar1,kCfdOutOfRangeError,&local_f0);
    location_1.funcname._6_1_ = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(ulong *)(*(long *)((long)local_28 + 8) + 0x28) <= (ulong)index) {
    pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
    local_110 = (undefined1  [8])(pcVar2 + 1);
    location_1.filename._0_4_ = (int)caller_local;
    location_1._8_8_ = psbt_pointer;
    logger::warn<unsigned_int&>
              ((CfdSourceLocation *)local_110,"tx vout[{}] out_of_range.",
               (uint *)((long)&caller_local + 4));
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_130,"tx vout out_of_range error.",&local_131);
    CfdException::CfdException(pCVar1,kCfdOutOfRangeError,&local_130);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void Psbt::CheckTxOutIndex(
    uint32_t index, int line, const char *caller) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  } else if (psbt_pointer->num_outputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "psbt vout[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "psbt vout out_of_range error.");
  } else if (psbt_pointer->tx->num_outputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "tx vout[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "tx vout out_of_range error.");
  }
}